

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string.hpp
# Opt level: O2

p_rank * __thiscall
dna_string::parallel_rank(p_rank *__return_storage_ptr__,dna_string *this,uint64_t i)

{
  pointer ppVar1;
  uint64_t *puVar2;
  ulong uVar3;
  pointer ppVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  ulong block_number;
  ulong superblock_number;
  ulong uVar9;
  p_rank local_38;
  
  superblock_number = i >> 0x20;
  block_number = i >> 7 & 0x1ffffff;
  ppVar4 = (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (ulong)(uint)((int)block_number << 6);
  uVar3 = *(ulong *)(this->data + uVar9 + 0x30 + superblock_number * 0x80000000);
  ppVar1 = ppVar4 + superblock_number;
  uVar5 = ppVar1->A;
  uVar6 = ppVar1->C;
  puVar2 = &ppVar4[superblock_number].G;
  uVar7 = *puVar2;
  uVar8 = puVar2[1];
  uVar9 = *(ulong *)(this->data + uVar9 + 0x38 + superblock_number * 0x80000000);
  block_rank(&local_38,this,superblock_number,block_number,(ulong)((uint)i & 0x7f));
  __return_storage_ptr__->A = uVar5 + (uVar3 & 0xffffffff) + local_38.A;
  __return_storage_ptr__->C = uVar6 + (uVar3 >> 0x20) + local_38.C;
  __return_storage_ptr__->G = (uVar9 & 0xffffffff) + uVar7 + local_38.G;
  __return_storage_ptr__->T = (uVar9 >> 0x20) + uVar8 + local_38.T;
  return __return_storage_ptr__;
}

Assistant:

p_rank parallel_rank(uint64_t i){

		uint64_t superblock_number = i / SUPERBLOCK_SIZE;
		uint64_t superblock_off = i % SUPERBLOCK_SIZE;
		uint64_t block_number = superblock_off / BLOCK_SIZE;
		uint64_t block_off = superblock_off % BLOCK_SIZE;

		p_rank superblock_r = superblock_ranks[superblock_number];
		p_rank block_r = get_counters(superblock_number,block_number);

		return superblock_r + block_r + block_rank(superblock_number, block_number, block_off);

	}